

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O0

void rr::anon_unknown_19::drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)6>
               (RenderState *state,RenderTarget *renderTarget,Program *program,
               VertexPacket **vertices,size_t numVertices,VertexPacketAllocator *vpalloc)

{
  pointer __n;
  iterator outputIterator;
  allocator<rr::pa::Point> local_59;
  undefined1 local_58 [8];
  vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> inputPrimitives;
  size_t assemblerPrimitiveCount;
  VertexPacketAllocator *vpalloc_local;
  size_t numVertices_local;
  VertexPacket **vertices_local;
  Program *program_local;
  RenderTarget *renderTarget_local;
  RenderState *state_local;
  
  __n = (pointer)pa::Points::getPrimitiveCount(numVertices);
  inputPrimitives.super__Vector_base<rr::pa::Point,_std::allocator<rr::pa::Point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __n;
  std::allocator<rr::pa::Point>::allocator(&local_59);
  std::vector<rr::pa::Point,_std::allocator<rr::pa::Point>_>::vector
            ((vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> *)local_58,(size_type)__n,
             &local_59);
  std::allocator<rr::pa::Point>::~allocator(&local_59);
  outputIterator =
       std::vector<rr::pa::Point,_std::allocator<rr::pa::Point>_>::begin
                 ((vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> *)local_58);
  pa::Points::
  exec<__gnu_cxx::__normal_iterator<rr::pa::Point*,std::vector<rr::pa::Point,std::allocator<rr::pa::Point>>>>
            ((__normal_iterator<rr::pa::Point_*,_std::vector<rr::pa::Point,_std::allocator<rr::pa::Point>_>_>
              )outputIterator._M_current,vertices,numVertices,state->provokingVertexConvention);
  rr::(anonymous_namespace)::
  makeSharedVerticesDistinct<std::vector<rr::pa::Point,std::allocator<rr::pa::Point>>>
            ((vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> *)local_58,vpalloc);
  rr::(anonymous_namespace)::
  drawBasicPrimitives<std::vector<rr::pa::Point,std::allocator<rr::pa::Point>>>
            (state,renderTarget,program,
             (vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> *)local_58,vpalloc);
  std::vector<rr::pa::Point,_std::allocator<rr::pa::Point>_>::~vector
            ((vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> *)local_58);
  return;
}

Assistant:

void drawGeometryShaderOutputAsPrimitives (const RenderState& state, const RenderTarget& renderTarget, const Program& program, VertexPacket* const* vertices, size_t numVertices, VertexPacketAllocator& vpalloc)
{
	// Run primitive assembly for generated stream

	const size_t															assemblerPrimitiveCount		= PrimitiveTypeTraits<DrawPrimitiveType>::Assembler::getPrimitiveCount(numVertices);
	std::vector<typename PrimitiveTypeTraits<DrawPrimitiveType>::BaseType>	inputPrimitives				(assemblerPrimitiveCount);

	PrimitiveTypeTraits<DrawPrimitiveType>::Assembler::exec(inputPrimitives.begin(), vertices, numVertices, state.provokingVertexConvention); // \note input Primitives are baseType_t => only basic primitives (non adjacency) will compile

	// Make shared vertices distinct

	makeSharedVerticesDistinct(inputPrimitives, vpalloc);

	// Draw assembled primitives

	drawBasicPrimitives(state, renderTarget, program, inputPrimitives, vpalloc);
}